

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v10::detail::check_char_specs<char>(format_specs<char> *specs)

{
  long in_RDI;
  char *unaff_retaddr;
  undefined1 local_1;
  
  if (((*(char *)(in_RDI + 8) == '\0') || (*(char *)(in_RDI + 8) == '\x0f')) ||
     (*(char *)(in_RDI + 8) == '\x12')) {
    if (((((byte)*(undefined2 *)(in_RDI + 9) & 0xf) == 4) ||
        ((*(ushort *)(in_RDI + 9) >> 4 & 7) != 0)) || ((*(ushort *)(in_RDI + 9) >> 7 & 1) != 0)) {
      throw_format_error(unaff_retaddr);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const format_specs<Char>& specs) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr &&
      specs.type != presentation_type::debug) {
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    throw_format_error("invalid format specifier for char");
  return true;
}